

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParserNsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlParserNsData *pxVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  xmlChar **ppxVar5;
  xmlParserNsBucket *bucket;
  xmlHashedString hprefix;
  xmlParserNsBucket *local_48;
  xmlHashedString local_40;
  
  lVar4 = (long)ctxt->nsNr;
  lVar2 = lVar4 - nr;
  if (0 < nr) {
    pxVar1 = ctxt->nsdb;
    ppxVar5 = ctxt->nsTab + lVar4 * 2;
    piVar3 = &pxVar1->extra[lVar4 + -1].oldIndex;
    do {
      ppxVar5 = ppxVar5 + -2;
      local_40.name = *ppxVar5;
      if (local_40.name == (xmlChar *)0x0) {
        pxVar1->defaultNsIndex = *piVar3;
      }
      else {
        local_48 = (xmlParserNsBucket *)0x0;
        local_40.hashValue = piVar3[-3];
        xmlParserNsLookup(ctxt,&local_40,&local_48);
        local_48->index = *piVar3;
      }
      lVar4 = lVar4 + -1;
      piVar3 = piVar3 + -6;
    } while (lVar2 < lVar4);
  }
  ctxt->nsNr = (int)lVar2;
  return nr;
}

Assistant:

static int
xmlParserNsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    /* assert(nr <= ctxt->nsNr); */

    for (i = ctxt->nsNr - 1; i >= ctxt->nsNr - nr; i--) {
        const xmlChar *prefix = ctxt->nsTab[i * 2];
        xmlParserNsExtra *extra = &ctxt->nsdb->extra[i];

        if (prefix == NULL) {
            ctxt->nsdb->defaultNsIndex = extra->oldIndex;
        } else {
            xmlHashedString hprefix;
            xmlParserNsBucket *bucket = NULL;

            hprefix.name = prefix;
            hprefix.hashValue = extra->prefixHashValue;
            xmlParserNsLookup(ctxt, &hprefix, &bucket);
            /* assert(bucket && bucket->hashValue); */
            bucket->index = extra->oldIndex;
        }
    }

    ctxt->nsNr -= nr;
    return(nr);
}